

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O2

void RunThread(_func_void *fn)

{
  _func_void *local_20;
  _func_void *fn_local;
  
  local_20 = fn;
  std::thread::thread<void(*&)(),,void>((thread *)&fn_local,&local_20);
  std::thread::join();
  std::thread::~thread((thread *)&fn_local);
  return;
}

Assistant:

void RunThread(void (*fn)()) {
    std::thread{fn}.join();
  }